

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O0

void __thiscall
serialize_tests::OtherParamChecker::
Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
          (OtherParamChecker *this,
          ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
          *s)

{
  bool bVar1;
  OtherParam *pOVar2;
  long in_FS_OFFSET;
  uint8_t value;
  uint8_t param;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
  *in_stack_ffffffffffffff28;
  lazy_ostream *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  const_string *msg;
  undefined1 *line_num;
  const_string *file;
  char *this_00;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  const_string local_30;
  undefined1 local_20 [22];
  undefined1 local_a;
  uint8_t local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar2 = ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
           ::GetParams<serialize_tests::OtherParam>
                     ((ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
                       *)in_stack_ffffffffffffff28);
  local_9 = pOVar2->param;
  ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>
  ::operator>>((ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
                *)in_stack_ffffffffffffff38,(uchar *)in_stack_ffffffffffffff30);
  do {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/serialize_tests.cpp"
    ;
    line_num = local_20;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff38,
               (pointer)in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28);
    file = &local_30;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffff30,(char (*) [1])in_stack_ffffffffffffff28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff38,
               (pointer)in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff38 = "param";
    in_stack_ffffffffffffff30 = (lazy_ostream *)&stack0xfffffffffffffff7;
    in_stack_ffffffffffffff28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)0x1ba8aa7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_char>
              (local_50,local_60,0x17f,1,2,&local_a);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(in_stack_ffffffffffffff28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s) const
    {
        const uint8_t param = s.template GetParams<OtherParam>().param;
        uint8_t value;
        s >> value;
        BOOST_CHECK_EQUAL(value, param);
    }